

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O1

ion_err_t sl_destroy(ion_skiplist_t *skiplist)

{
  sl_node *psVar1;
  ion_sl_node_t *__ptr;
  
  __ptr = skiplist->head;
  while (__ptr != (ion_sl_node_t *)0x0) {
    psVar1 = *__ptr->next;
    free(__ptr->key);
    free(__ptr->value);
    free(__ptr->next);
    free(__ptr);
    __ptr = psVar1;
  }
  skiplist->head = (ion_sl_node_t *)0x0;
  return '\0';
}

Assistant:

ion_err_t
sl_destroy(
	ion_skiplist_t *skiplist
) {
	ion_sl_node_t *cursor = skiplist->head, *tofree;

	while (cursor != NULL) {
		tofree	= cursor;
		cursor	= cursor->next[0];
		free(tofree->key);
		free(tofree->value);
		free(tofree->next);
		free(tofree);
	}

	skiplist->head = NULL;

	return err_ok;
}